

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

string * cmsys::SystemTools::ConvertToUnixOutputPath(string *__return_storage_ptr__,string *path)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  string result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  while( true ) {
    uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x7f1518);
    if (uVar2 == 0xffffffffffffffff) break;
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar2);
  }
  lVar3 = std::__cxx11::string::find((char)__return_storage_ptr__,0x20);
  if (lVar3 != -1) {
    result._M_dataplus._M_p = (pointer)&result.field_2;
    result._M_string_length = 0;
    result.field_2._M_local_buf[0] = '\0';
    cVar1 = '\x01';
    for (pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p; *pcVar4 != '\0'; pcVar4 = pcVar4 + 1)
    {
      if ((*pcVar4 == ' ') && (cVar1 != '\\')) {
        std::__cxx11::string::push_back((char)&result);
      }
      std::__cxx11::string::push_back((char)&result);
      cVar1 = *pcVar4;
    }
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&result);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::ConvertToUnixOutputPath(const std::string& path)
{
  std::string ret = path;

  // remove // except at the beginning might be a cygwin drive
  std::string::size_type pos = 1;
  while ((pos = ret.find("//", pos)) != std::string::npos) {
    ret.erase(pos, 1);
  }
  // escape spaces and () in the path
  if (ret.find_first_of(' ') != std::string::npos) {
    std::string result;
    char lastch = 1;
    for (const char* ch = ret.c_str(); *ch != '\0'; ++ch) {
      // if it is already escaped then don't try to escape it again
      if ((*ch == ' ') && lastch != '\\') {
        result += '\\';
      }
      result += *ch;
      lastch = *ch;
    }
    ret = result;
  }
  return ret;
}